

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_write_buffer(FILE *f,uint32_t n,char *data,char *errmsg)

{
  size_t sVar1;
  void *in_RDX;
  uint in_ESI;
  FILE *in_RDI;
  size_t nb;
  uint local_c;
  FILE *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  sVar1 = fwrite(&local_c,1,4,in_RDI);
  if (sVar1 != 4) {
    mcpl_error((char *)0x102965);
  }
  sVar1 = fwrite(in_RDX,1,(ulong)local_c,local_8);
  if (sVar1 != local_c) {
    mcpl_error((char *)0x10299a);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_write_buffer(FILE* f, uint32_t n, const char * data, const char * errmsg)
{
  size_t nb = fwrite(&n, 1, sizeof(n), f);
  if (nb!=sizeof(n))
    mcpl_error(errmsg);
  nb = fwrite(data, 1, n, f);
  if (nb!=n)
    mcpl_error(errmsg);
}